

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_to_imp.c
# Opt level: O2

int indexForIMP(IMP anIMP,trampoline_set **setptr)

{
  trampoline_set *ptVar1;
  trampoline_set **pptVar2;
  
  pptVar2 = setptr;
  while( true ) {
    ptVar1 = *pptVar2;
    if (ptVar1 == (trampoline_set *)0x0) {
      return -1;
    }
    if (anIMP < ptVar1->buffers + 1 && ptVar1->buffers->rx_buffer <= anIMP) break;
    pptVar2 = &ptVar1->next;
  }
  *setptr = ptVar1;
  return (int)((ulong)(anIMP + (-0x1000 - (long)ptVar1->buffers)) >> 4);
}

Assistant:

static int indexForIMP(IMP anIMP, struct trampoline_set **setptr)
{
	for (struct trampoline_set *set=*setptr ; set!=NULL ; set=set->next)
	{
		if (((char*)anIMP >= set->buffers->rx_buffer) &&
		    ((char*)anIMP < &set->buffers->rx_buffer[PAGE_SIZE]))
		{
			*setptr = set;
			ptrdiff_t offset = (char*)anIMP - set->buffers->rx_buffer;
			return offset / sizeof(struct block_header);
		}
	}
	return -1;
}